

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_property.cpp
# Opt level: O0

CharInfo MeCab::anon_unknown_3::encode
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *c,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
                       *category)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  ostream *poVar4;
  const_reference pvVar5;
  pointer ppVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  const_iterator it_1;
  size_t i;
  const_iterator it;
  CharInfo base;
  ostream *in_stack_fffffffffffffe98;
  die local_81;
  iterator local_80;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>
  local_78;
  iterator local_70;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>
  local_68;
  ulong local_60;
  byte local_52;
  die local_51;
  iterator local_50;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>
  local_48;
  iterator local_40;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>
  local_38 [3];
  byte local_1a;
  die local_19 [9];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_10;
  CharInfo local_4;
  
  local_10 = in_RDI;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDI);
  local_1a = 0;
  if (sVar3 == 0) {
    die::die(local_19);
    local_1a = 1;
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                            );
    poVar4 = std::operator<<(poVar4,"(");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x37);
    poVar4 = std::operator<<(poVar4,") [");
    poVar4 = std::operator<<(poVar4,"c.size()");
    poVar4 = std::operator<<(poVar4,"] ");
    poVar4 = std::operator<<(poVar4,"category size is empty");
    die::operator&(local_19,poVar4);
  }
  if ((local_1a & 1) != 0) {
    die::~die((die *)0x14c039);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_10,0);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
               *)in_stack_fffffffffffffe98,(key_type *)0x14c06a);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>
  ::_Rb_tree_const_iterator(local_38,&local_40);
  local_50._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
              *)in_stack_fffffffffffffe98);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>
  ::_Rb_tree_const_iterator(&local_48,&local_50);
  bVar2 = std::operator!=(local_38,&local_48);
  local_52 = 0;
  if (!bVar2) {
    die::die(&local_51);
    local_52 = 1;
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                            );
    poVar4 = std::operator<<(poVar4,"(");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x3a);
    poVar4 = std::operator<<(poVar4,") [");
    poVar4 = std::operator<<(poVar4,"it != category->end()");
    poVar4 = std::operator<<(poVar4,"] ");
    poVar4 = std::operator<<(poVar4,"category [");
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_10,0);
    poVar4 = std::operator<<(poVar4,(string *)pvVar5);
    poVar4 = std::operator<<(poVar4,"] is undefined");
    die::operator&(&local_51,poVar4);
  }
  if ((local_52 & 1) != 0) {
    die::~die((die *)0x14c216);
  }
  ppVar6 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>
           ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>
                         *)0x14c223);
  local_4 = ppVar6->second;
  for (local_60 = 0; uVar1 = local_60,
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(local_10), uVar1 < sVar3; local_60 = local_60 + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_10,local_60);
    local_70._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
                 *)in_stack_fffffffffffffe98,(key_type *)0x14c293);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>
    ::_Rb_tree_const_iterator(&local_68,&local_70);
    local_80._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
                *)in_stack_fffffffffffffe98);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>
    ::_Rb_tree_const_iterator(&local_78,&local_80);
    bVar2 = std::operator!=(&local_68,&local_78);
    if (!bVar2) {
      die::die(&local_81);
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                              );
      poVar4 = std::operator<<(poVar4,"(");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x41);
      poVar4 = std::operator<<(poVar4,") [");
      poVar4 = std::operator<<(poVar4,"it != category->end()");
      poVar4 = std::operator<<(poVar4,"] ");
      poVar4 = std::operator<<(poVar4,"category [");
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_10,local_60);
      poVar4 = std::operator<<(poVar4,(string *)pvVar5);
      in_stack_fffffffffffffe98 = std::operator<<(poVar4,"] is undefined");
      die::operator&(&local_81,in_stack_fffffffffffffe98);
      die::~die((die *)0x14c429);
    }
    ppVar6 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>
                           *)0x14c436);
    local_4 = (CharInfo)
              ((uint)local_4 & 0xfffc0000 |
              ((uint)local_4 & 0x3ffff) + (1 << ((byte)((uint)ppVar6->second >> 0x12) & 0x1f)) &
              0x3ffff);
  }
  return local_4;
}

Assistant:

CharInfo encode(const std::vector<std::string> &c,
                std::map<std::string, CharInfo> *category) {
  CHECK_DIE(c.size()) << "category size is empty";

  std::map<std::string, CharInfo>::const_iterator it = category->find(c[0]);
  CHECK_DIE(it != category->end())
      << "category [" << c[0] << "] is undefined";

  CharInfo base = it->second;
  for (size_t i = 0; i < c.size(); ++i) {
    std::map<std::string, CharInfo>::const_iterator it =
        category->find(c[i]);
    CHECK_DIE(it != category->end())
        << "category [" << c[i] << "] is undefined";
    base.type += (1 << it->second.default_type);
  }

  return base;
}